

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSparseSDF.h
# Opt level: O0

void __thiscall btSparseSdf<3>::Reset(btSparseSdf<3> *this)

{
  Cell *pCVar1;
  int iVar2;
  Cell **ppCVar3;
  btAlignedObjectArray<btSparseSdf<3>::Cell_*> *in_RDI;
  Cell *pn;
  Cell *pc;
  int ni;
  int i;
  Cell *local_18;
  int local_c;
  
  local_c = 0;
  iVar2 = btAlignedObjectArray<btSparseSdf<3>::Cell_*>::size(in_RDI);
  for (; local_c < iVar2; local_c = local_c + 1) {
    ppCVar3 = btAlignedObjectArray<btSparseSdf<3>::Cell_*>::operator[](in_RDI,local_c);
    pCVar1 = *ppCVar3;
    ppCVar3 = btAlignedObjectArray<btSparseSdf<3>::Cell_*>::operator[](in_RDI,local_c);
    *ppCVar3 = (Cell *)0x0;
    while (local_18 = pCVar1, local_18 != (Cell *)0x0) {
      pCVar1 = local_18->next;
      if (local_18 != (Cell *)0x0) {
        ::operator_delete(local_18);
      }
    }
  }
  *(undefined4 *)(in_RDI + 1) = 0x3e800000;
  in_RDI[1].m_size = 0;
  in_RDI[1].m_capacity = 0;
  *(undefined4 *)&in_RDI[1].m_data = 1;
  *(undefined4 *)((long)&in_RDI[1].m_data + 4) = 1;
  return;
}

Assistant:

void					Reset()
	{
		for(int i=0,ni=cells.size();i<ni;++i)
		{
			Cell*	pc=cells[i];
			cells[i]=0;
			while(pc)
			{
				Cell*	pn=pc->next;
				delete pc;
				pc=pn;
			}
		}
		voxelsz		=0.25;
		puid		=0;
		ncells		=0;
		nprobes		=1;
		nqueries	=1;
	}